

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O0

void __thiscall
Eigen::TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Index nbRows;
  Index nbCols;
  Matrix<double,__1,__1,_0,__1,__1> *dst;
  TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U> *this_01;
  MatrixTypeNestedCleaned *src;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other_local;
  TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
  *this_local;
  
  this_00 = &EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                       ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  nbRows = TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>
           ::rows((TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                   *)this);
  nbCols = TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>
           ::cols((TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                   *)this);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(this_00,nbRows,nbCols);
  dst = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                  ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other);
  this_01 = TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>
            ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                       *)this);
  src = TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>::nestedExpression
                  (this_01);
  internal::
  triangular_assignment_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U,_-1,_true>
  ::run(dst,src);
  return;
}

Assistant:

void TriangularBase<Derived>::evalToLazy(MatrixBase<DenseDerived> &other) const
{
  enum {
    unroll = DenseDerived::SizeAtCompileTime != Dynamic
                   && internal::traits<Derived>::CoeffReadCost != Dynamic
                   && DenseDerived::SizeAtCompileTime * internal::traits<Derived>::CoeffReadCost / 2
                        <= EIGEN_UNROLLING_LIMIT
  };
  other.derived().resize(this->rows(), this->cols());

  internal::triangular_assignment_selector
    <DenseDerived, typename internal::traits<Derived>::MatrixTypeNestedCleaned, Derived::Mode,
    unroll ? int(DenseDerived::SizeAtCompileTime) : Dynamic,
    true // clear the opposite triangular part
    >::run(other.derived(), derived().nestedExpression());
}